

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.cpp
# Opt level: O0

void __thiscall
JointPolicyDiscretePure::JointPolicyDiscretePure
          (JointPolicyDiscretePure *this,I_PtPDpure_constPtr *pu,PolicyDomainCategory idc)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  shared_ptr<const_Interface_ProblemToPolicyDiscrete> *iptpd;
  JointPolicyDiscrete *in_stack_ffffffffffffffc0;
  shared_ptr<const_Interface_ProblemToPolicyDiscrete> local_28 [2];
  
  iptpd = local_28;
  boost::shared_ptr<Interface_ProblemToPolicyDiscrete_const>::
  shared_ptr<Interface_ProblemToPolicyDiscretePure_const>(iptpd,in_RSI);
  JointPolicyDiscrete::JointPolicyDiscrete
            (in_stack_ffffffffffffffc0,iptpd,(PolicyDomainCategory)((ulong)in_RDI >> 0x20));
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscrete>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)0x985d5f);
  *in_RDI = &PTR_operator__00d14448;
  return;
}

Assistant:

JointPolicyDiscretePure::JointPolicyDiscretePure(
        const I_PtPDpure_constPtr &pu,
        PolicyGlobals::PolicyDomainCategory idc ) :
    JointPolicyDiscrete( pu , idc )
{
    
}